

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_textedit_locate_coord(nk_text_edit *edit,float x,float y,nk_user_font *font,float row_height)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  int len;
  nk_rune unicode;
  int local_5c;
  nk_rune local_58;
  float local_54;
  nk_text_edit_row local_50;
  nk_str *local_38;
  
  iVar4 = (edit->string).len;
  iVar3 = 0;
  local_50.x0 = 0.0;
  local_50.x1 = 0.0;
  local_50.ymin = 0.0;
  local_50.ymax = 0.0;
  local_50.num_chars = 0;
  if (iVar4 < 1) {
    return iVar4;
  }
  local_38 = &edit->string;
  fVar7 = 0.0;
  local_54 = row_height;
  do {
    nk_textedit_layout_row(&local_50,edit,iVar3,local_54,font);
    iVar1 = local_50.num_chars;
    if (local_50.num_chars < 1) {
      return iVar4;
    }
    if ((iVar3 == 0) && (y < local_50.ymin + fVar7)) {
      return 0;
    }
    if (y < local_50.ymax + fVar7) {
      if (x < local_50.x0) {
        return iVar3;
      }
      iVar4 = iVar3;
      if (x < local_50.x1) {
        fVar7 = local_50.x0;
        iVar5 = local_50.num_chars;
        do {
          local_5c = 0;
          local_58 = 0;
          pcVar2 = nk_str_at_const(local_38,iVar3,&local_58,&local_5c);
          fVar6 = (*font->width)(font->userdata,font->height,pcVar2,local_5c);
          if (x < fVar7 + fVar6) {
            if (x < fVar7 + fVar6 * 0.5) {
              return iVar3;
            }
            return iVar3 + 1;
          }
          iVar3 = iVar3 + 1;
          iVar5 = iVar5 + -1;
          fVar7 = fVar7 + fVar6;
          iVar4 = iVar1;
        } while (iVar5 != 0);
      }
      iVar3 = iVar4 + iVar1 + -1;
      local_58 = 0;
      nk_str_at_const(local_38,iVar3,&local_58,&local_5c);
      iVar4 = iVar1 + iVar4;
      if (local_58 == 10) {
        iVar4 = iVar3;
      }
      return iVar4;
    }
    iVar3 = iVar3 + local_50.num_chars;
    fVar7 = fVar7 + local_50.baseline_y_delta;
  } while (iVar3 < iVar4);
  return iVar4;
}

Assistant:

NK_INTERN int
nk_textedit_locate_coord(struct nk_text_edit *edit, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    struct nk_text_edit_row r;
    int n = edit->string.len;
    float base_y = 0, prev_x;
    int i=0, k;

    r.x0 = r.x1 = 0;
    r.ymin = r.ymax = 0;
    r.num_chars = 0;

    /* search rows to find one that straddles 'y' */
    while (i < n) {
        nk_textedit_layout_row(&r, edit, i, row_height, font);
        if (r.num_chars <= 0)
            return n;

        if (i==0 && y < base_y + r.ymin)
            return 0;

        if (y < base_y + r.ymax)
            break;

        i += r.num_chars;
        base_y += r.baseline_y_delta;
    }

    /* below all text, return 'after' last character */
    if (i >= n)
        return n;

    /* check if it's before the beginning of the line */
    if (x < r.x0)
        return i;

    /* check if it's before the end of the line */
    if (x < r.x1) {
        /* search characters in row for one that straddles 'x' */
        k = i;
        prev_x = r.x0;
        for (i=0; i < r.num_chars; ++i) {
            float w = nk_textedit_get_width(edit, k, i, font);
            if (x < prev_x+w) {
                if (x < prev_x+w/2)
                    return k+i;
                else return k+i+1;
            }
            prev_x += w;
        }
        /* shouldn't happen, but if it does, fall through to end-of-line case */
    }

    /* if the last character is a newline, return that.
     * otherwise return 'after' the last character */
    if (nk_str_rune_at(&edit->string, i+r.num_chars-1) == '\n')
        return i+r.num_chars-1;
    else return i+r.num_chars;
}